

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cgstrf.c
# Opt level: O3

void cgstrf(superlu_options_t *options,SuperMatrix *A,int relax,int panel_size,int *etree,void *work
           ,int_t lwork,int *perm_c,int *perm_r,SuperMatrix *L,SuperMatrix *U,GlobalLU_t *Glu,
           SuperLUStat_t *stat,int_t *info)

{
  uint n;
  int iVar1;
  int_t *piVar2;
  superlu_options_t *psVar3;
  int iVar4;
  uint n_00;
  int_t iVar5;
  int_t iVar6;
  int iVar7;
  int iVar8;
  int_t *piVar9;
  long lVar10;
  ulong uVar11;
  ulong uVar12;
  ulong uVar13;
  long lVar14;
  uint uVar15;
  long lVar16;
  int local_180;
  int nseg;
  superlu_options_t *local_178;
  int *repfnz;
  int *segrep;
  fact_t local_160;
  int nseg1;
  int *local_158;
  singlecomplex *dense;
  int_t *xprune;
  ulong local_140;
  int *local_138;
  int *local_130;
  int *marker;
  int_t nnzU;
  int_t nnzL;
  int usepr;
  int pivrow;
  int_t nzlumax;
  ulong local_108;
  int_t *local_100;
  ulong local_f8;
  ulong local_f0;
  int_t *local_e8;
  singlecomplex *tempv;
  int_t *xplore;
  int local_cc;
  int_t *local_c8;
  int_t *local_c0;
  int *local_b8;
  int *local_b0;
  SuperMatrix *local_a8;
  int *local_a0;
  int_t *local_98;
  int_t *local_90;
  int_t *local_88;
  double local_80;
  int *panel_lsub;
  int *parent;
  singlecomplex *cwork;
  int *iwork;
  int_t *local_58;
  long local_50;
  long local_48;
  flops_t *local_40;
  long local_38;
  
  local_130 = (int *)CONCAT44(local_130._4_4_,relax);
  local_158 = etree;
  iVar4 = sp_ienv(6);
  local_160 = options->Fact;
  local_80 = options->DiagPivotThresh;
  local_a0 = stat->panel_histo;
  local_40 = stat->ops;
  uVar15 = A->nrow;
  local_108 = (ulong)uVar15;
  n = A->ncol;
  local_140 = (ulong)n;
  n_00 = n;
  if ((int)uVar15 < (int)n) {
    n_00 = uVar15;
  }
  piVar9 = (int_t *)A->Store;
  local_38 = *(long *)(piVar9 + 2);
  local_88 = *(int_t **)(piVar9 + 4);
  local_90 = *(int_t **)(piVar9 + 6);
  local_98 = *(int_t **)(piVar9 + 8);
  local_f8 = (ulong)(uint)panel_size;
  local_a8 = A;
  iVar5 = cLUMemInit(local_160,work,lwork,uVar15,n,*piVar9,panel_size,(float)iVar4,L,U,Glu,&iwork,
                     &cwork);
  uVar13 = local_108;
  *info = iVar5;
  if (iVar5 != 0) {
    return;
  }
  iVar4 = (int)local_130;
  local_b0 = Glu->xsup;
  local_b8 = Glu->supno;
  local_c0 = Glu->xlsub;
  local_c8 = Glu->xlusup;
  local_e8 = Glu->xusub;
  iVar8 = (int)local_108;
  iVar7 = (int)local_f8;
  local_178 = options;
  SetIWork(iVar8,(int)local_140,iVar7,iwork,&segrep,&parent,&xplore,&repfnz,&panel_lsub,&xprune,
           &marker);
  cSetRWork(iVar8,iVar7,cwork,&dense,&tempv);
  usepr = (int)(local_160 == SamePattern_SameRowPerm);
  if (local_160 == SamePattern_SameRowPerm) {
    local_138 = int32Malloc(iVar8);
    if (0 < iVar8) {
      uVar12 = 0;
      do {
        local_138[perm_r[uVar12]] = (int)uVar12;
        uVar12 = uVar12 + 1;
      } while (uVar13 != uVar12);
    }
  }
  else {
    local_138 = (int *)0x0;
  }
  uVar12 = local_140;
  psVar3 = local_178;
  iVar7 = (int)local_140;
  local_130 = int32Malloc(iVar7);
  if (0 < iVar7) {
    uVar11 = 0;
    do {
      local_130[perm_c[uVar11]] = (int)uVar11;
      uVar11 = uVar11 + 1;
    } while (uVar12 != uVar11);
  }
  piVar9 = intMalloc(iVar7);
  if (psVar3->SymmetricMode == YES) {
    heap_relax_snode(iVar7,local_158,iVar4,marker,piVar9);
  }
  else {
    relax_snode(iVar7,local_158,iVar4,marker,piVar9);
  }
  ifill(perm_r,iVar8,-1);
  ifill(marker,iVar8 * 3,-1);
  *local_b8 = -1;
  uVar11 = 0;
  *local_c8 = 0;
  *local_e8 = 0;
  *local_c0 = 0;
  *local_b0 = 0;
  local_100 = piVar9;
  if ((int)n_00 < 1) {
    *info = 0;
  }
  else {
    local_58 = piVar9 + 1;
    local_50 = (long)iVar8 * 4;
    local_48 = (long)iVar8 << 3;
    local_180 = 0;
    do {
      iVar7 = (int)uVar11;
      lVar14 = (long)iVar7;
      iVar4 = local_100[lVar14];
      if (iVar4 == -1) {
        local_158 = (int *)(uVar11 & 0xffffffff);
        uVar15 = (int)local_f8 + iVar7;
        if ((int)n_00 <= (int)uVar15) {
          uVar15 = n_00;
        }
        uVar13 = 0;
        do {
          if ((long)(int)uVar15 <= (long)(lVar14 + 1 + uVar13)) {
            uVar15 = iVar7 + (int)uVar13 + 1;
            uVar12 = local_f8;
            goto LAB_00106270;
          }
          uVar12 = uVar13 + 1;
          lVar10 = lVar14 + uVar13;
          uVar13 = uVar12;
        } while (local_58[lVar10] == -1);
        uVar15 = iVar7 + (int)uVar12;
LAB_00106270:
        iVar4 = n_00 - iVar7;
        if (uVar15 != n_00) {
          iVar4 = (int)uVar12;
        }
        local_a0[iVar4] = local_a0[iVar4] + 1;
        iVar8 = (int)local_108;
        cpanel_dfs(iVar8,iVar4,iVar7,local_a8,perm_r,&nseg1,dense,panel_lsub,segrep,repfnz,xprune,
                   marker,parent,xplore,Glu);
        cpanel_bmod(iVar8,iVar4,iVar7,nseg1,dense,tempv,segrep,repfnz,Glu,stat);
        uVar11 = (ulong)(uint)(iVar7 + iVar4);
        if (0 < iVar4) {
          local_178 = (superlu_options_t *)(long)(iVar7 + iVar4);
          lVar16 = 0;
          lVar10 = 0;
          local_f0 = uVar11;
          do {
            nseg = nseg1;
            iVar7 = (int)lVar14;
            iVar4 = ccolumn_dfs((int)local_108,iVar7,perm_r,&nseg,(int *)((long)panel_lsub + lVar10)
                                ,segrep,(int *)((long)repfnz + lVar10),xprune,marker,parent,xplore,
                                Glu);
            *info = iVar4;
            if (iVar4 != 0) {
              return;
            }
            iVar4 = ccolumn_bmod(iVar7,nseg - nseg1,(singlecomplex *)((long)&dense->r + lVar16),
                                 tempv,segrep + nseg1,(int *)((long)repfnz + lVar10),(int)local_158,
                                 Glu,stat);
            *info = iVar4;
            if (iVar4 != 0) {
              return;
            }
            iVar4 = ccopy_to_ucol(iVar7,nseg,segrep,(int *)((long)repfnz + lVar10),perm_r,
                                  (singlecomplex *)((long)&dense->r + lVar16),Glu);
            *info = iVar4;
            if (iVar4 != 0) {
              return;
            }
            iVar8 = cpivotL(iVar7,local_80,&usepr,perm_r,local_138,local_130,&pivrow,Glu,stat);
            *info = iVar8;
            iVar4 = local_180;
            if (local_180 == 0) {
              iVar4 = iVar8;
            }
            if (iVar8 != 0) {
              local_180 = iVar4;
            }
            cpruneL(iVar7,perm_r,pivrow,nseg,segrep,(int *)((long)repfnz + lVar10),xprune,Glu);
            resetrep_col(nseg,segrep,(int *)((long)repfnz + lVar10));
            lVar14 = lVar14 + 1;
            lVar10 = lVar10 + local_50;
            lVar16 = lVar16 + local_48;
            uVar11 = local_f0;
          } while (lVar14 < (long)local_178);
        }
      }
      else {
        local_a0[(long)(iVar4 - iVar7) + 1] = local_a0[(long)(iVar4 - iVar7) + 1] + 1;
        local_cc = iVar4;
        iVar5 = csnode_dfs(iVar7,iVar4,local_88,local_90,local_98,xprune,marker,Glu);
        *info = iVar5;
        if (iVar5 != 0) {
          return;
        }
        local_158 = (int *)CONCAT44(local_158._4_4_,local_e8[lVar14]);
        iVar5 = local_c8[lVar14];
        local_178 = (superlu_options_t *)(long)local_b8[lVar14];
        local_f0 = (ulong)local_b0[(long)local_178];
        iVar8 = local_c0[local_f0 + 1];
        iVar1 = local_c0[local_f0];
        nzlumax = Glu->nzlumax;
        while (nzlumax < (iVar8 - iVar1) * ((iVar4 - iVar7) + 1) + iVar5) {
          iVar6 = cLUMemXpand(iVar7,iVar5,LUSUP,&nzlumax,Glu);
          *info = iVar6;
          if (iVar6 != 0) {
            return;
          }
        }
        if (iVar7 <= local_cc) {
          uVar15 = local_cc + 1;
          do {
            local_e8[lVar14 + 1] = (int_t)local_158;
            lVar10 = (long)local_90[lVar14];
            if (local_90[lVar14] < local_98[lVar14]) {
              do {
                dense[local_88[lVar10]] = *(singlecomplex *)(local_38 + lVar10 * 8);
                lVar10 = lVar10 + 1;
              } while (lVar10 < local_98[lVar14]);
            }
            lVar10 = lVar14 + 1;
            csnode_bmod((int)lVar14,(int)local_178,(int)local_f0,dense,tempv,Glu,stat);
            iVar7 = cpivotL((int)lVar14,local_80,&usepr,perm_r,local_138,local_130,&pivrow,Glu,stat)
            ;
            *info = iVar7;
            iVar4 = local_180;
            if (local_180 == 0) {
              iVar4 = iVar7;
            }
            if (iVar7 != 0) {
              local_180 = iVar4;
            }
            lVar14 = lVar10;
          } while (uVar15 != (uint)lVar10);
          uVar11 = (ulong)uVar15;
        }
      }
    } while ((int)uVar11 < (int)n_00);
    *info = local_180;
    iVar4 = local_180 + -1;
    uVar13 = local_108;
    uVar12 = local_140;
    if (local_180 != 0) goto LAB_00106574;
  }
  iVar4 = (int)uVar12;
LAB_00106574:
  iVar7 = (int)uVar13;
  if (0 < iVar7 && iVar4 < iVar7) {
    uVar12 = 1;
    do {
      if (perm_r[uVar12 - 1] == -1) {
        perm_r[uVar12 - 1] = iVar4;
        iVar4 = iVar4 + 1;
      }
    } while ((uVar12 < uVar13) && (uVar12 = uVar12 + 1, iVar4 < iVar7));
  }
  countnz(n_00,xprune,&nnzL,&nnzU,Glu);
  fixupL(n_00,perm_r,Glu);
  cLUWorkFree(iwork,cwork,Glu);
  superlu_free(xplore);
  superlu_free(xprune);
  if (local_160 == SamePattern_SameRowPerm) {
    piVar9 = (int_t *)L->Store;
    *piVar9 = nnzL;
    piVar9[1] = Glu->supno[(int)local_140];
    piVar2 = Glu->xlusup;
    *(void **)(piVar9 + 2) = Glu->lusup;
    *(int_t **)(piVar9 + 4) = piVar2;
    piVar2 = Glu->xlsub;
    *(int_t **)(piVar9 + 6) = Glu->lsub;
    *(int_t **)(piVar9 + 8) = piVar2;
    piVar9 = (int_t *)U->Store;
    *piVar9 = nnzU;
    piVar2 = Glu->usub;
    *(void **)(piVar9 + 2) = Glu->ucol;
    *(int_t **)(piVar9 + 4) = piVar2;
    *(int_t **)(piVar9 + 6) = Glu->xusub;
  }
  else {
    cCreate_SuperNode_Matrix
              (L,local_a8->nrow,n_00,nnzL,(singlecomplex *)Glu->lusup,Glu->xlusup,Glu->lsub,
               Glu->xlsub,Glu->supno,Glu->xsup,SLU_SC,SLU_C,SLU_TRLU);
    cCreate_CompCol_Matrix
              (U,n_00,n_00,nnzU,(singlecomplex *)Glu->ucol,Glu->usub,Glu->xusub,SLU_NC,SLU_C,SLU_TRU
              );
  }
  piVar9 = local_100;
  local_40[7] = local_40[0x13] + local_40[0x14] + local_40[7];
  iVar4 = Glu->num_expansions + -1;
  Glu->num_expansions = iVar4;
  stat->expansions = iVar4;
  if (local_160 == SamePattern_SameRowPerm) {
    superlu_free(local_138);
  }
  superlu_free(local_130);
  superlu_free(piVar9);
  return;
}

Assistant:

void
cgstrf (superlu_options_t *options, SuperMatrix *A,
        int relax, int panel_size, int *etree, void *work, int_t lwork,
        int *perm_c, int *perm_r, SuperMatrix *L, SuperMatrix *U,
    	GlobalLU_t *Glu, /* persistent to facilitate multiple factorizations */
        SuperLUStat_t *stat, int_t *info)
{
    /* Local working arrays */
    NCPformat *Astore;
    int       *iperm_r = NULL; /* inverse of perm_r; used when 
                                  options->Fact == SamePattern_SameRowPerm */
    int       *iperm_c; /* inverse of perm_c */
    int       *iwork;
    singlecomplex    *cwork;
    int	      *segrep, *repfnz, *parent;
    int	      *panel_lsub; /* dense[]/panel_lsub[] pair forms a w-wide SPA */
    int_t     *xprune, *xplore;
    int	      *marker;
    singlecomplex    *dense, *tempv;
    int       *relax_end;
    singlecomplex    *a;
    int_t     *asub, *xa_begin, *xa_end;
    int_t     *xlsub, *xlusup, *xusub;
    int       *xsup, *supno;
    int_t     nzlumax;
    float fill_ratio = sp_ienv(6);  /* estimated fill ratio */

    /* Local scalars */
    fact_t    fact = options->Fact;
    double    diag_pivot_thresh = options->DiagPivotThresh;
    int       pivrow;   /* pivotal row number in the original matrix A */
    int       nseg1;	/* no of segments in U-column above panel row jcol */
    int       nseg;	/* no of segments in each U-column */
    register int jcol, jj;
    register int kcol;	/* end column of a relaxed snode */
    register int icol;
    int_t     i, k, iinfo, new_next, nextlu, nextu;
    int       m, n, min_mn, jsupno, fsupc;
    int       w_def;	/* upper bound on panel width */
    int       usepr, iperm_r_allocated = 0;
    int_t     nnzL, nnzU;
    int       *panel_histo = stat->panel_histo;
    flops_t   *ops = stat->ops;

    iinfo    = 0;
    m        = A->nrow;
    n        = A->ncol;
    min_mn   = SUPERLU_MIN(m, n);
    Astore   = A->Store;
    a        = Astore->nzval;
    asub     = Astore->rowind;
    xa_begin = Astore->colbeg;
    xa_end   = Astore->colend;

    /* Allocate storage common to the factor routines */
    *info = cLUMemInit(fact, work, lwork, m, n, Astore->nnz,
                       panel_size, fill_ratio, L, U, Glu, &iwork, &cwork);
    if ( *info ) return;
    
    xsup    = Glu->xsup;
    supno   = Glu->supno;
    xlsub   = Glu->xlsub;
    xlusup  = Glu->xlusup;
    xusub   = Glu->xusub;
    
    SetIWork(m, n, panel_size, iwork, &segrep, &parent, &xplore,
	     &repfnz, &panel_lsub, &xprune, &marker);
    cSetRWork(m, panel_size, cwork, &dense, &tempv);
    
    usepr = (fact == SamePattern_SameRowPerm);
    if ( usepr ) {
	/* Compute the inverse of perm_r */
	iperm_r = (int *) int32Malloc(m);
	for (k = 0; k < m; ++k) iperm_r[perm_r[k]] = k;
	iperm_r_allocated = 1;
    }
    iperm_c = (int *) int32Malloc(n);
    for (k = 0; k < n; ++k) iperm_c[perm_c[k]] = k;

    /* Identify relaxed snodes */
    relax_end = (int *) intMalloc(n);
    if ( options->SymmetricMode == YES ) {
        heap_relax_snode(n, etree, relax, marker, relax_end); 
    } else {
        relax_snode(n, etree, relax, marker, relax_end); 
    }
    
    ifill (perm_r, m, SLU_EMPTY);
    ifill (marker, m * NO_MARKER, SLU_EMPTY);
    supno[0] = -1;
    xsup[0]  = xlsub[0] = xusub[0] = xlusup[0] = 0;
    w_def    = panel_size;

    /* 
     * Work on one "panel" at a time. A panel is one of the following: 
     *	   (a) a relaxed supernode at the bottom of the etree, or
     *	   (b) panel_size contiguous columns, defined by the user
     */
    for (jcol = 0; jcol < min_mn; ) {

	if ( relax_end[jcol] != SLU_EMPTY ) { /* start of a relaxed snode */
   	    kcol = relax_end[jcol];	  /* end of the relaxed snode */
	    panel_histo[kcol-jcol+1]++;

	    /* --------------------------------------
	     * Factorize the relaxed supernode(jcol:kcol) 
	     * -------------------------------------- */
	    /* Determine the union of the row structure of the snode */
	    if ( (*info = csnode_dfs(jcol, kcol, asub, xa_begin, xa_end,
				    xprune, marker, Glu)) != 0 )
		return;

            nextu    = xusub[jcol];
	    nextlu   = xlusup[jcol];
	    jsupno   = supno[jcol];
	    fsupc    = xsup[jsupno];
	    new_next = nextlu + (xlsub[fsupc+1]-xlsub[fsupc])*(kcol-jcol+1);
	    nzlumax = Glu->nzlumax;
	    while ( new_next > nzlumax ) {
		if ( (*info = cLUMemXpand(jcol, nextlu, LUSUP, &nzlumax, Glu)) )
		    return;
	    }
    
	    for (icol = jcol; icol<= kcol; icol++) {
		xusub[icol+1] = nextu;
		
    		/* Scatter into SPA dense[*] */
    		for (k = xa_begin[icol]; k < xa_end[icol]; k++)
        	    dense[asub[k]] = a[k];

	       	/* Numeric update within the snode */
	        csnode_bmod(icol, jsupno, fsupc, dense, tempv, Glu, stat);

		if ( (*info = cpivotL(icol, diag_pivot_thresh, &usepr, perm_r,
				      iperm_r, iperm_c, &pivrow, Glu, stat)) )
		    if ( iinfo == 0 ) iinfo = *info;
		
#if ( DEBUGlevel>=2 )
		cprint_lu_col("[1]: ", icol, pivrow, xprune, Glu);
#endif

	    }

	    jcol = icol;

	} else { /* Work on one panel of panel_size columns */
	    
	    /* Adjust panel_size so that a panel won't overlap with the next 
	     * relaxed snode.
	     */
	    panel_size = w_def;
	    for (k = jcol + 1; k < SUPERLU_MIN(jcol+panel_size, min_mn); k++) 
		if ( relax_end[k] != SLU_EMPTY ) {
		    panel_size = k - jcol;
		    break;
		}
	    if ( k == min_mn ) panel_size = min_mn - jcol;
	    panel_histo[panel_size]++;

	    /* symbolic factor on a panel of columns */
	    cpanel_dfs(m, panel_size, jcol, A, perm_r, &nseg1,
		      dense, panel_lsub, segrep, repfnz, xprune,
		      marker, parent, xplore, Glu);
	    
	    /* numeric sup-panel updates in topological order */
	    cpanel_bmod(m, panel_size, jcol, nseg1, dense,
		        tempv, segrep, repfnz, Glu, stat);
	    
	    /* Sparse LU within the panel, and below panel diagonal */
    	    for ( jj = jcol; jj < jcol + panel_size; jj++) {
 		k = (jj - jcol) * m; /* column index for w-wide arrays */

		nseg = nseg1;	/* Begin after all the panel segments */

	    	if ((*info = ccolumn_dfs(m, jj, perm_r, &nseg, &panel_lsub[k],
					segrep, &repfnz[k], xprune, marker,
					parent, xplore, Glu)) != 0) return;

	      	/* Numeric updates */
	    	if ((*info = ccolumn_bmod(jj, (nseg - nseg1), &dense[k],
					 tempv, &segrep[nseg1], &repfnz[k],
					 jcol, Glu, stat)) != 0) return;
		
	        /* Copy the U-segments to ucol[*] */
		if ((*info = ccopy_to_ucol(jj, nseg, segrep, &repfnz[k],
					  perm_r, &dense[k], Glu)) != 0)
		    return;

	    	if ( (*info = cpivotL(jj, diag_pivot_thresh, &usepr, perm_r,
				      iperm_r, iperm_c, &pivrow, Glu, stat)) )
		    if ( iinfo == 0 ) iinfo = *info;

		/* Prune columns (0:jj-1) using column jj */
	    	cpruneL(jj, perm_r, pivrow, nseg, segrep,
                        &repfnz[k], xprune, Glu);

		/* Reset repfnz[] for this column */
	    	resetrep_col (nseg, segrep, &repfnz[k]);
		
#if ( DEBUGlevel>=2 )
		cprint_lu_col("[2]: ", jj, pivrow, xprune, Glu);
#endif

	    }

   	    jcol += panel_size;	/* Move to the next panel */

	} /* else */

    } /* for */

    *info = iinfo;

    /* Complete perm_r[] for rank-deficient or tall-skinny matrices */
    /* k is the rank of U
       pivots have been completed for rows < k
       Now fill in the pivots for rows k to m */
    k = iinfo == 0 ? n : (int)iinfo - 1;
    if (m > k) {
        /* if k == m, then all the row permutations are complete and
           we can short circuit looking through the rest of the vector */
        for (i = 0; i < m && k < m; ++i) {
            if (perm_r[i] == SLU_EMPTY) {
                perm_r[i] = k;
                ++k;
            }

        }
    }
    
    countnz(min_mn, xprune, &nnzL, &nnzU, Glu);
    fixupL(min_mn, perm_r, Glu);

    cLUWorkFree(iwork, cwork, Glu); /* Free work space and compress storage */
    SUPERLU_FREE(xplore);
    SUPERLU_FREE(xprune);

    if ( fact == SamePattern_SameRowPerm ) {
        /* L and U structures may have changed due to possibly different
	   pivoting, even though the storage is available.
	   There could also be memory expansions, so the array locations
           may have changed, */
        ((SCformat *)L->Store)->nnz = nnzL;
	((SCformat *)L->Store)->nsuper = Glu->supno[n];
	((SCformat *)L->Store)->nzval = (singlecomplex *) Glu->lusup;
	((SCformat *)L->Store)->nzval_colptr = Glu->xlusup;
	((SCformat *)L->Store)->rowind = Glu->lsub;
	((SCformat *)L->Store)->rowind_colptr = Glu->xlsub;
	((NCformat *)U->Store)->nnz = nnzU;
	((NCformat *)U->Store)->nzval = (singlecomplex *) Glu->ucol;
	((NCformat *)U->Store)->rowind = Glu->usub;
	((NCformat *)U->Store)->colptr = Glu->xusub;
    } else {
        cCreate_SuperNode_Matrix(L, A->nrow, min_mn, nnzL, 
	      (singlecomplex *) Glu->lusup, Glu->xlusup, 
              Glu->lsub, Glu->xlsub, Glu->supno, Glu->xsup,
              SLU_SC, SLU_C, SLU_TRLU);
    	cCreate_CompCol_Matrix(U, min_mn, min_mn, nnzU, 
	      (singlecomplex *) Glu->ucol, Glu->usub, Glu->xusub,
              SLU_NC, SLU_C, SLU_TRU);
    }
    
    ops[FACT] += ops[TRSV] + ops[GEMV];	
    stat->expansions = --(Glu->num_expansions);
    
    if ( iperm_r_allocated ) SUPERLU_FREE (iperm_r);
    SUPERLU_FREE (iperm_c);
    SUPERLU_FREE (relax_end);

}